

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frac.hpp
# Opt level: O2

Frac<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator/=
          (Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this,
          Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *x)

{
  BigInt<unsigned_int,_unsigned_long> q;
  BigInt<unsigned_int,_unsigned_long> p;
  BigInt<unsigned_int,_unsigned_long> local_60;
  BigInt<unsigned_int,_unsigned_long> local_40;
  
  operator*(&local_40,&this->_p,&x->_q);
  operator*(&local_60,&this->_q,&x->_p);
  BigInt<unsigned_int,_unsigned_long>::operator=(&this->_p,&local_40);
  BigInt<unsigned_int,_unsigned_long>::operator=(&this->_q,&local_60);
  _simplify(this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40);
  return this;
}

Assistant:

constexpr Frac<TValue>& Frac<TValue>::operator/=(const Frac<TValue>& x)
	{
		const TValue p = _p * x._q;
		const TValue q = _q * x._p;

		_p = p;
		_q = q;

		_simplify();

		return *this;
	}